

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O2

void __thiscall blc::math::Float::Float(Float *this,double i,int E)

{
  int iVar1;
  
  (this->super_serializable)._vptr_serializable = (_func_int **)&PTR_serialize_abi_cxx11__0011aa80;
  this->_nb = i;
  this->_E = E;
  if ((i != 0.0) || (NAN(i))) {
    if (ABS(i) <= 1.0) {
      iVar1 = E + -1;
      while (ABS(i) < 1.0) {
        this->_E = iVar1;
        i = i * 10.0;
        this->_nb = i;
        iVar1 = iVar1 + -1;
      }
    }
    else {
      iVar1 = E + 1;
      while (10.0 <= ABS(i)) {
        this->_E = iVar1;
        i = i / 10.0;
        this->_nb = i;
        iVar1 = iVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

blc::math::Float::Float(double i, int E) : _nb(i), _E(E) {
	if (this->_nb == 0)
		return;
	if (this->_nb > 1 || this->_nb < -1) {
		for (; this->_nb >= 10 || this->_nb <= -10;) {
			this->_E++;
			this->_nb /= 10;
		}
	} else {
		for (; this->_nb < 1 && this->_nb > -1;) {
			this->_E--;
			this->_nb *= 10;
		}
	}
}